

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O2

uint64_t __thiscall MemoryManager::getLong(MemoryManager *this,uint32_t addr,uint32_t *cycles)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  
  bVar1 = getByte(this,addr,cycles);
  bVar2 = getByte(this,addr + 1,(uint32_t *)0x0);
  bVar3 = getByte(this,addr + 2,(uint32_t *)0x0);
  bVar4 = getByte(this,addr + 3,(uint32_t *)0x0);
  bVar5 = getByte(this,addr + 4,(uint32_t *)0x0);
  bVar6 = getByte(this,addr + 5,(uint32_t *)0x0);
  bVar7 = getByte(this,addr + 6,(uint32_t *)0x0);
  bVar8 = getByte(this,addr + 7,(uint32_t *)0x0);
  return ((ulong)bVar8 << 0x38) +
         ((ulong)bVar7 << 0x30 |
         (ulong)bVar6 << 0x28 |
         (ulong)bVar5 << 0x20 |
         (ulong)bVar4 << 0x18 | (ulong)bVar3 << 0x10 | (ulong)bVar2 * 0x100 + (ulong)bVar1);
}

Assistant:

uint64_t MemoryManager::getLong(uint32_t addr, uint32_t *cycles) {
  uint64_t b1 = this->getByte(addr, cycles);
  uint64_t b2 = this->getByte(addr + 1);
  uint64_t b3 = this->getByte(addr + 2);
  uint64_t b4 = this->getByte(addr + 3);
  uint64_t b5 = this->getByte(addr + 4);
  uint64_t b6 = this->getByte(addr + 5);
  uint64_t b7 = this->getByte(addr + 6);
  uint64_t b8 = this->getByte(addr + 7);
  return b1 + (b2 << 8) + (b3 << 16) + (b4 << 24) + (b5 << 32) + (b6 << 40) +
         (b7 << 48) + (b8 << 56);
}